

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O0

ogt_mesh_vec2i get_cardinal_unit_vector(ogt_mesh_vec2i *vec)

{
  bool bVar1;
  ogt_mesh_vec2i *vec_local;
  
  if (((vec->x != 0) || (bVar1 = true, vec->y == 0)) && (bVar1 = false, vec->y == 0)) {
    bVar1 = vec->x != 0;
  }
  if (bVar1) {
    if ((uint)vec->x < 0x80000000) {
      if (vec->x < 1) {
        if ((uint)vec->y < 0x80000000) {
          if (vec->y < 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                          ,0x42b,"ogt_mesh_vec2i get_cardinal_unit_vector(const ogt_mesh_vec2i &)");
          }
          vec_local = (ogt_mesh_vec2i *)make_vec2i(0,1);
        }
        else {
          vec_local = (ogt_mesh_vec2i *)make_vec2i(0,-1);
        }
      }
      else {
        vec_local = (ogt_mesh_vec2i *)make_vec2i(1,0);
      }
    }
    else {
      vec_local = (ogt_mesh_vec2i *)make_vec2i(-1,0);
    }
    return (ogt_mesh_vec2i)vec_local;
  }
  __assert_fail("(vec.x == 0 && vec.y != 0) || (vec.y == 0 && vec.x != 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                ,0x426,"ogt_mesh_vec2i get_cardinal_unit_vector(const ogt_mesh_vec2i &)");
}

Assistant:

ogt_mesh_vec2i get_cardinal_unit_vector(const ogt_mesh_vec2i& vec) {
    assert((vec.x == 0 && vec.y != 0) || (vec.y == 0 && vec.x != 0));	// assumes this is a cardinal vector	
    if (vec.x <= -1) return make_vec2i(-1, 0);
    if (vec.x >=  1) return make_vec2i( 1, 0);
    if (vec.y <= -1) return make_vec2i( 0,-1);
    if (vec.y >=  1) return make_vec2i( 0, 1);
    assert(0); // unreachable unless the above assert already failed!
    return make_vec2i(0,0);
}